

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Approx::toString_abi_cxx11_(Approx *this)

{
  ReusableStringStream *this_00;
  string *in_RDI;
  ReusableStringStream rss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  ReusableStringStream *in_stack_ffffffffffffff80;
  string local_50 [16];
  ReusableStringStream *in_stack_ffffffffffffffc0;
  
  ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff80);
  ReusableStringStream::operator<<
            (in_stack_ffffffffffffff80,(char (*) [9])in_stack_ffffffffffffff78);
  Detail::stringify<double>((double *)in_stack_ffffffffffffff78);
  this_00 = ReusableStringStream::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  ReusableStringStream::operator<<(this_00,(char (*) [3])in_stack_ffffffffffffff78);
  std::__cxx11::string::~string(local_50);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff78);
  ReusableStringStream::~ReusableStringStream(in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

std::string Approx::toString() const {
        ReusableStringStream rss;
        rss << "Approx( " << ::Catch::Detail::stringify( m_value ) << " )";
        return rss.str();
    }